

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  U32 UVar3;
  seqDef *psVar4;
  bool bVar5;
  undefined8 uVar6;
  seqStore_t *psVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  BYTE *pBVar12;
  uint uVar13;
  BYTE *pBVar14;
  int *piVar15;
  U32 UVar16;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  int *piVar20;
  uint uVar21;
  BYTE *pBVar22;
  int iVar23;
  int *piVar24;
  ulong uVar25;
  uint uVar26;
  size_t ofbCandidate;
  U32 maxDistance;
  uint local_ec;
  ulong local_e0;
  size_t local_d8;
  int *local_d0;
  int *local_c8;
  ulong local_c0;
  seqStore_t *local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  int local_a0;
  uint local_9c;
  BYTE *local_98;
  int *local_90;
  ulong local_88;
  int *local_80;
  int *local_78;
  uint *local_70;
  BYTE *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  iEnd = (int *)((long)src + srcSize);
  piVar20 = (int *)((long)src + (srcSize - 8));
  pBVar14 = (ms->window).base;
  pBVar12 = (ms->window).dictBase;
  uVar13 = (ms->window).dictLimit;
  uVar11 = (ulong)uVar13;
  local_98 = pBVar14 + uVar11;
  uVar8 = (ms->window).lowLimit;
  uVar2 = (ms->cParams).windowLog;
  uVar26 = (ms->cParams).minMatch;
  uVar21 = 6;
  if (uVar26 < 6) {
    uVar21 = uVar26;
  }
  local_9c = 4;
  if (4 < uVar21) {
    local_9c = uVar21;
  }
  uVar26 = *rep;
  local_ec = rep[1];
  ms->lazySkipping = 0;
  piVar24 = (int *)((ulong)(local_98 == (BYTE *)src) + (long)src);
  local_c8 = (int *)src;
  local_70 = rep;
  if (piVar24 < piVar20) {
    local_90 = (int *)(pBVar12 + uVar11);
    local_68 = pBVar12 + uVar8;
    uVar8 = 1 << ((byte)uVar2 & 0x1f);
    local_88 = (ulong)uVar8;
    local_a0 = uVar13 - 1;
    local_80 = iEnd + -8;
    iVar9 = (int)pBVar14;
    local_58 = (ulong)(1 - (uVar8 + iVar9));
    local_50 = (ulong)(1 - iVar9);
    local_60 = (ulong)((uVar13 + iVar9) - 2);
    local_c0 = uVar11;
    local_b8 = seqStore;
    local_b0 = pBVar12;
    local_a8 = pBVar14;
    local_78 = piVar20;
    do {
      iVar23 = (int)piVar24;
      iVar9 = (iVar23 - (int)pBVar14) + 1;
      UVar3 = (ms->window).lowLimit;
      UVar16 = iVar9 - (uint)local_88;
      if (iVar9 - UVar3 <= (uint)local_88) {
        UVar16 = UVar3;
      }
      if (ms->loadedDictEnd != 0) {
        UVar16 = UVar3;
      }
      uVar13 = iVar9 - uVar26;
      if (uVar13 < (uint)uVar11) {
        pBVar14 = pBVar12;
      }
      local_d0 = (int *)((long)piVar24 + 1);
      if (local_a0 - uVar13 < 3) {
LAB_0016c5ec:
        uVar19 = 0;
      }
      else {
        uVar19 = 0;
        if (uVar26 <= iVar9 - UVar16) {
          if (*local_d0 != *(int *)(pBVar14 + uVar13)) goto LAB_0016c5ec;
          piVar15 = iEnd;
          if (uVar13 < (uint)uVar11) {
            piVar15 = local_90;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar24 + 5),(BYTE *)((long)(pBVar14 + uVar13) + 4),
                              (BYTE *)iEnd,(BYTE *)piVar15,local_98);
          uVar19 = sVar10 + 4;
        }
      }
      local_d8 = 999999999;
      if (local_9c == 6) {
        uVar11 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar24,(BYTE *)iEnd,&local_d8);
      }
      else if (local_9c == 5) {
        uVar11 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar24,(BYTE *)iEnd,&local_d8);
      }
      else {
        uVar11 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar24,(BYTE *)iEnd,&local_d8);
      }
      local_e0 = uVar19;
      if (uVar19 < uVar11) {
        local_e0 = uVar11;
      }
      if (local_e0 < 4) {
        uVar11 = (long)piVar24 - (long)local_c8;
        piVar24 = (int *)((long)piVar24 + (uVar11 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar11);
        pBVar14 = local_a8;
        pBVar12 = local_b0;
        uVar11 = local_c0;
      }
      else {
        piVar20 = piVar24;
        uVar25 = local_d8;
        if (uVar11 <= uVar19) {
          piVar20 = local_d0;
          uVar25 = 1;
        }
        local_38 = (ulong)(uint)((int)local_58 + iVar23);
        uVar13 = (int)local_50 + iVar23;
        local_40 = (ulong)uVar13;
        uVar8 = ((int)local_60 + uVar26) - iVar23;
        local_48 = (ulong)(uVar13 - uVar26);
        lVar18 = 0;
        local_d0 = piVar20;
        do {
          if (local_78 <= (int *)(lVar18 + (long)piVar24)) break;
          piVar20 = (int *)((long)piVar24 + lVar18 + 1);
          if (uVar25 == 0) {
            uVar25 = 0;
          }
          else {
            UVar3 = (ms->window).lowLimit;
            iVar23 = (int)lVar18;
            iVar9 = (int)local_40 + iVar23;
            UVar16 = (int)local_38 + iVar23;
            if (iVar9 - UVar3 <= (uint)local_88) {
              UVar16 = UVar3;
            }
            if (ms->loadedDictEnd != 0) {
              UVar16 = UVar3;
            }
            uVar13 = (int)local_48 + iVar23;
            pBVar14 = local_a8;
            if (uVar13 < (uint)local_c0) {
              pBVar14 = local_b0;
            }
            if (((2 < uVar8) && (uVar26 <= iVar9 - UVar16)) &&
               (*piVar20 == *(int *)(pBVar14 + uVar13))) {
              piVar15 = iEnd;
              if (uVar13 < (uint)local_c0) {
                piVar15 = local_90;
              }
              sVar10 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar24 + lVar18 + 5),
                                  (BYTE *)((long)(pBVar14 + uVar13) + 4),(BYTE *)iEnd,
                                  (BYTE *)piVar15,local_98);
              if (sVar10 < 0xfffffffffffffffc) {
                uVar13 = 0x1f;
                if ((uint)uVar25 != 0) {
                  for (; (uint)uVar25 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                  }
                }
                if ((int)((uVar13 ^ 0x1f) + (int)local_e0 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                  uVar25 = 1;
                  local_e0 = sVar10 + 4;
                  local_d0 = piVar20;
                }
              }
            }
          }
          local_d8 = 999999999;
          if (local_9c == 6) {
            uVar11 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
          }
          else if (local_9c == 5) {
            uVar11 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
          }
          else {
            uVar11 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
          }
          bVar5 = true;
          if (3 < uVar11) {
            uVar13 = 0x1f;
            if ((uint)uVar25 != 0) {
              for (; (uint)uVar25 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            iVar9 = 0x1f;
            if ((uint)local_d8 != 0) {
              for (; (uint)local_d8 >> iVar9 == 0; iVar9 = iVar9 + -1) {
              }
            }
            if ((int)((uVar13 ^ 0x1f) + (int)local_e0 * 4 + -0x1b) < (int)uVar11 * 4 - iVar9) {
              bVar5 = false;
              uVar25 = local_d8;
              local_e0 = uVar11;
              local_d0 = piVar20;
            }
          }
          lVar18 = lVar18 + 1;
          uVar8 = uVar8 - 1;
        } while (!bVar5);
        piVar24 = local_d0;
        uVar13 = uVar26;
        if (3 < uVar25) {
          pcVar17 = (char *)((long)local_d0 + (3 - (long)(local_a8 + uVar25)));
          pBVar12 = local_98;
          pBVar14 = local_a8;
          if ((uint)pcVar17 < (uint)local_c0) {
            pBVar12 = local_68;
            pBVar14 = local_b0;
          }
          if ((local_c8 < local_d0) &&
             (uVar11 = (ulong)pcVar17 & 0xffffffff, pBVar12 < pBVar14 + uVar11)) {
            pBVar14 = pBVar14 + uVar11;
            do {
              piVar20 = (int *)((long)piVar24 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar20 != *pBVar14) ||
                 (local_e0 = local_e0 + 1, piVar24 = piVar20, piVar20 <= local_c8)) break;
            } while (pBVar12 < pBVar14);
          }
          uVar13 = (U32)uVar25 - 3;
          local_ec = uVar26;
        }
        if (local_b8->maxNbSeq <=
            (ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart >> 3)) {
LAB_0016cca4:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_b8->maxNbLit) {
LAB_0016cd01:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar11 = (long)piVar24 - (long)local_c8;
        pBVar14 = local_b8->lit;
        if (local_b8->litStart + local_b8->maxNbLit < pBVar14 + uVar11) {
LAB_0016cd20:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar24) {
LAB_0016cce2:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_80 < piVar24) {
          ZSTD_safecopyLiterals(pBVar14,(BYTE *)local_c8,(BYTE *)piVar24,(BYTE *)local_80);
        }
        else {
          uVar6 = *(undefined8 *)(local_c8 + 2);
          *(undefined8 *)pBVar14 = *(undefined8 *)local_c8;
          *(undefined8 *)(pBVar14 + 8) = uVar6;
          if (0x10 < uVar11) {
            pBVar14 = local_b8->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar14 + 0x10 + (-0x10 - (long)(local_c8 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)(local_c8 + 6);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(local_c8 + 4);
            *(undefined8 *)(pBVar14 + 0x18) = uVar6;
            if (0x20 < (long)uVar11) {
              lVar18 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_c8 + lVar18 + 0x20);
                uVar6 = puVar1[1];
                pBVar12 = pBVar14 + lVar18 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)local_c8 + lVar18 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                lVar18 = lVar18 + 0x20;
              } while (pBVar12 + 0x20 < pBVar14 + uVar11);
            }
          }
        }
        piVar20 = local_78;
        psVar7 = local_b8;
        local_b8->lit = local_b8->lit + uVar11;
        if (0xffff < uVar11) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_literalLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4 = local_b8->sequences;
        psVar4->litLength = (U16)uVar11;
        psVar4->offBase = (U32)uVar25;
        if (local_e0 < 3) {
LAB_0016ccc3:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_e0 - 3) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
LAB_0016cd3f:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_matchLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(local_e0 - 3);
        local_b8->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar24 = (int *)((long)piVar24 + local_e0);
        pBVar14 = local_a8;
        pBVar12 = local_b0;
        uVar11 = local_c0;
        local_c8 = piVar24;
        do {
          uVar26 = uVar13;
          if (piVar20 < piVar24) break;
          iVar9 = (int)piVar24 - (int)pBVar14;
          UVar3 = (ms->window).lowLimit;
          UVar16 = iVar9 - (uint)local_88;
          if (iVar9 - UVar3 <= (uint)local_88) {
            UVar16 = UVar3;
          }
          if (ms->loadedDictEnd != 0) {
            UVar16 = UVar3;
          }
          uVar8 = iVar9 - local_ec;
          pBVar22 = pBVar14;
          if (uVar8 < (uint)uVar11) {
            pBVar22 = pBVar12;
          }
          if (((local_a0 - uVar8 < 3) || (iVar9 - UVar16 < local_ec)) ||
             (*piVar24 != *(int *)(pBVar22 + uVar8))) {
            bVar5 = false;
            uVar8 = local_ec;
          }
          else {
            piVar15 = iEnd;
            if (uVar8 < (uint)uVar11) {
              piVar15 = local_90;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar24 + 1),(BYTE *)((long)(pBVar22 + uVar8) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar15,local_98);
            if (psVar7->maxNbSeq <=
                (ulong)((long)psVar7->sequences - (long)psVar7->sequencesStart >> 3))
            goto LAB_0016cca4;
            if (0x20000 < psVar7->maxNbLit) goto LAB_0016cd01;
            pBVar14 = psVar7->lit;
            if (psVar7->litStart + psVar7->maxNbLit < pBVar14) goto LAB_0016cd20;
            if (iEnd < local_c8) goto LAB_0016cce2;
            if (local_80 < local_c8) {
              ZSTD_safecopyLiterals(pBVar14,(BYTE *)local_c8,(BYTE *)local_c8,(BYTE *)local_80);
            }
            else {
              uVar6 = *(undefined8 *)(local_c8 + 2);
              *(undefined8 *)pBVar14 = *(undefined8 *)local_c8;
              *(undefined8 *)(pBVar14 + 8) = uVar6;
            }
            psVar4 = psVar7->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_0016ccc3;
            if (0xffff < sVar10 + 1) {
              if (psVar7->longLengthType != ZSTD_llt_none) goto LAB_0016cd3f;
              psVar7->longLengthType = ZSTD_llt_matchLength;
              psVar7->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar7->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar10 + 1);
            psVar7->sequences = psVar4 + 1;
            piVar24 = (int *)((long)piVar24 + sVar10 + 4);
            bVar5 = true;
            pBVar14 = local_a8;
            pBVar12 = local_b0;
            uVar11 = local_c0;
            uVar8 = uVar13;
            uVar13 = local_ec;
            local_c8 = piVar24;
          }
          local_ec = uVar8;
          uVar26 = uVar13;
        } while (bVar5);
      }
    } while (piVar24 < piVar20);
  }
  *local_70 = uVar26;
  local_70[1] = local_ec;
  return (long)iEnd - (long)local_c8;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}